

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemmodeltester.cpp
# Opt level: O0

void __thiscall
QAbstractItemModelTesterPrivate::layoutAboutToBeChanged(QAbstractItemModelTesterPrivate *this)

{
  long lVar1;
  bool bVar2;
  QAbstractItemModel *pQVar3;
  int *piVar4;
  long in_RDI;
  long in_FS_OFFSET;
  int in_stack_00000050;
  int i;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffff1c;
  QList<QPersistentModelIndex> *in_stack_ffffffffffffff20;
  QAbstractItemModel *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  int local_7c;
  undefined1 local_70 [24];
  undefined1 local_58 [16];
  char *in_stack_ffffffffffffffb8;
  QPersistentModelIndex in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  ChangeInFlight *in_stack_ffffffffffffffd0;
  ChangeInFlight *in_stack_ffffffffffffffd8;
  QAbstractItemModelTesterPrivate *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = 0x38a;
  bVar2 = compare<QAbstractItemModelTesterPrivate::ChangeInFlight,QAbstractItemModelTesterPrivate::ChangeInFlight>
                    (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                     (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                     (char *)in_stack_ffffffffffffffc0.d,in_stack_ffffffffffffffb8,in_stack_00000050
                    );
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    *(undefined4 *)(in_RDI + 0xc4) = 4;
    local_7c = 0;
    while( true ) {
      pQVar3 = QPointer<QAbstractItemModel>::operator->((QPointer<QAbstractItemModel> *)0x191625);
      QModelIndex::QModelIndex((QModelIndex *)0x191637);
      (**(code **)(*(long *)pQVar3 + 0x78))(pQVar3,&stack0xffffffffffffffd0);
      piVar4 = qBound<int>((int *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                           (int *)in_stack_ffffffffffffff28,(int *)in_stack_ffffffffffffff20);
      if (*piVar4 <= local_7c) break;
      in_stack_ffffffffffffff28 =
           QPointer<QAbstractItemModel>::operator->((QPointer<QAbstractItemModel> *)0x1916a4);
      in_stack_ffffffffffffff34 = local_7c;
      QModelIndex::QModelIndex((QModelIndex *)0x1916c0);
      (**(code **)(*(long *)in_stack_ffffffffffffff28 + 0x60))
                (local_58,in_stack_ffffffffffffff28,in_stack_ffffffffffffff34,0,local_70);
      QPersistentModelIndex::QPersistentModelIndex
                ((QPersistentModelIndex *)&stack0xffffffffffffffc0,(QModelIndex *)local_58);
      QList<QPersistentModelIndex>::append
                (in_stack_ffffffffffffff20,(rvalue_ref)CONCAT44(in_stack_ffffffffffffff1c,uVar5));
      QPersistentModelIndex::~QPersistentModelIndex
                ((QPersistentModelIndex *)&stack0xffffffffffffffc0);
      local_7c = local_7c + 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemModelTesterPrivate::layoutAboutToBeChanged()
{
    MODELTESTER_COMPARE(changeInFlight, ChangeInFlight::None);
    changeInFlight = ChangeInFlight::LayoutChanged;

    for (int i = 0; i < qBound(0, model->rowCount(), 100); ++i)
        changing.append(QPersistentModelIndex(model->index(i, 0)));
}